

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,AssignStmt *stmt)

{
  byte bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong local_28;
  
  uVar2 = hash_var(stmt->left_);
  uVar3 = hash_var(stmt->right_);
  uVar4 = (uVar3 << 1 | (ulong)((long)uVar3 < 0)) ^ uVar2;
  bVar1 = (byte)(this->super_IRVisitor).level & 0x3f;
  local_28 = uVar4 << bVar1 | uVar4 >> 0x40 - bVar1;
  std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->stmt_hashes_,&local_28);
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
        uint64_t stmt_hash = hash_var(stmt->left()) ^ (shift(hash_var(stmt->right()), 1));
        // based on level
        stmt_hash = shift(stmt_hash, level);
        stmt_hashes_.emplace_back(stmt_hash);
    }